

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::wheelEvent(QTextEdit *this,QWheelEvent *e)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  QTextEditPrivate *e_00;
  QWidget *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  float delta;
  QTextEditPrivate *d;
  KeyboardModifier other;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QFlagsStorageHelper<Qt::KeyboardModifier,_4> local_14;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_10;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_c;
  long local_8;
  
  other = (KeyboardModifier)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  e_00 = d_func((QTextEdit *)0x6d50be);
  local_10.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QWidgetTextControl::textInteractionFlags
                 ((QWidgetTextControl *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  local_c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),other);
  bVar1 = QFlags<Qt::TextInteractionFlag>::operator!((QFlags<Qt::TextInteractionFlag> *)&local_c);
  if (bVar1) {
    QInputEvent::modifiers
              ((QInputEvent *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    local_14.super_QFlagsStorage<Qt::KeyboardModifier>.i =
         (QFlagsStorage<Qt::KeyboardModifier>)
         QFlags<Qt::KeyboardModifier>::operator&
                   ((QFlags<Qt::KeyboardModifier> *)
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),other);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) {
      QWheelEvent::angleDelta
                ((QWheelEvent *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      iVar3 = QPoint::y((QPoint *)0x6d5144);
      zoomInF((QTextEdit *)e_00,(float)iVar3 / 120.0);
      goto LAB_006d5189;
    }
  }
  QAbstractScrollArea::wheelEvent((QAbstractScrollArea *)in_RSI,(QWheelEvent *)e_00);
  QWidget::updateMicroFocus(in_RSI,(InputMethodQuery)((ulong)e_00 >> 0x20));
LAB_006d5189:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEdit::wheelEvent(QWheelEvent *e)
{
    Q_D(QTextEdit);
    if (!(d->control->textInteractionFlags() & Qt::TextEditable)) {
        if (e->modifiers() & Qt::ControlModifier) {
            float delta = e->angleDelta().y() / 120.f;
            zoomInF(delta);
            return;
        }
    }
    QAbstractScrollArea::wheelEvent(e);
    updateMicroFocus();
}